

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdUVTexture>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdUVTexture *texture,string *warn,string *err,PrimReconstructOptions *options)

{
  _Any_data *p_Var1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  _Base_ptr p_Var4;
  texcoord2f tVar5;
  texcoord2f tVar6;
  undefined7 uVar7;
  TypedTerminalAttribute<std::array<float,_3UL>_> *pTVar8;
  undefined1 uVar9;
  char cVar10;
  undefined8 uVar11;
  char cVar12;
  int iVar13;
  ostream *poVar14;
  texcoord2f *ptVar15;
  optional<tinyusdz::value::texcoord2f> *poVar16;
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
  *pvVar17;
  undefined8 uVar18;
  void *pvVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_02;
  undefined8 *puVar21;
  const_iterator cVar22;
  mapped_type *this;
  _Base_ptr p_Var23;
  anon_struct_8_0_00000001_for___align __n;
  char *pcVar24;
  long lVar25;
  _Base_ptr p_Var26;
  undefined4 uVar27;
  PrimVar *this_00;
  ulong uVar28;
  char *pcVar29;
  Property *pPVar30;
  Animatable<tinyusdz::value::texcoord2f> *args_1;
  size_t i;
  _Base_ptr p_Var31;
  bool bVar32;
  bool bVar33;
  Animatable<tinyusdz::value::texcoord2f> animatable_value;
  ParseResult ret_1;
  Attribute *attr;
  optional<tinyusdz::value::texcoord2f> pv;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string attr_type_name;
  TypedTerminalAttribute<std::array<float,_3UL>_> *in_stack_fffffffffffffaa8;
  undefined1 local_550 [16];
  undefined1 local_540 [24];
  bool local_528;
  TypedTerminalAttribute<std::array<float,_3UL>_> *local_520;
  bool local_511;
  undefined1 local_510 [8];
  texcoord2f local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_500;
  undefined1 local_4f0;
  undefined7 uStack_4ef;
  bool local_4e8;
  undefined1 local_4e0 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d8;
  undefined1 local_4d0 [28];
  uint local_4b4;
  Property *local_4b0;
  string *local_4a8;
  undefined4 local_49c;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *local_498;
  _Base_ptr local_490;
  string local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_468;
  undefined8 local_460;
  Animatable<tinyusdz::value::texcoord2f> *local_458;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *local_450;
  PrimVar *local_448;
  _Base_ptr local_440;
  UsdUVTexture *local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_410;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *local_3e0;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::Wrap>_> *local_3d8;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
  *local_3d0;
  undefined1 local_3c8 [4];
  float fStack_3c4;
  undefined2 uStack_3c0;
  undefined2 uStack_3be;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined1 local_3a8;
  undefined7 uStack_3a7;
  bool local_3a0;
  undefined7 uStack_39f;
  undefined1 local_398;
  ios_base local_358 [16];
  ios_base local_348 [264];
  undefined1 local_240 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined8 local_220;
  _Base_ptr local_218;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [48];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  TypedTerminalAttribute<float> *local_190;
  storage_t<tinyusdz::Token> local_188;
  optional<tinyusdz::value::texcoord2f> local_164;
  _Base_ptr local_158 [2];
  _Base_ptr local_148 [2];
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  undefined1 auStack_80 [16];
  _Alloc_hider _Stack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined1 auStack_60 [16];
  optional<tinyusdz::Path::PathType> oStack_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  pointer pPStack_40;
  
  local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_410._M_t._M_impl.super__Rb_tree_header._M_header;
  local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_410._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_520 = (TypedTerminalAttribute<std::array<float,_3UL>_> *)err;
  local_4a8 = warn;
  local_438 = texture;
  local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _local_3c8 = (texcoord2f)local_3b8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_410,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c8);
  if (_local_3c8 != (texcoord2f)local_3b8) {
    operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
  }
  p_Var23 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var31 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_511 = p_Var23 == p_Var31;
  if (!local_511) {
    local_188._24_8_ = &local_438->file;
    local_210._0_8_ = &local_438->st;
    local_188._8_8_ = &(local_438->st)._paths;
    local_220 = &(local_438->st)._attrib;
    local_188._16_8_ = &local_438->outputsR;
    local_188.data._0_8_ = (undefined8)&local_438->outputsG;
    local_190 = &local_438->outputsB;
    local_1b8.contained._24_8_ = &local_438->outputsA;
    local_1b8.contained._16_8_ = &local_438->outputsRGB;
    local_1b8.contained._8_8_ = &(local_438->super_ShaderNode).super_UsdShadePrim.props;
    local_3e0 = &local_438->wrapT;
    local_3d8 = &local_438->wrapS;
    local_498 = &local_438->sourceColorSpace;
    local_490 = p_Var31;
    local_450 = local_498;
    local_3d0 = local_498;
    do {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,*(long *)(p_Var23 + 1),
                 (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
      _local_3c8 = (texcoord2f)local_3b8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"inputs:file","");
      args_1 = (Animatable<tinyusdz::value::texcoord2f> *)local_3c8;
      local_4b0 = (Property *)(p_Var23 + 2);
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::AssetPath>
                ((ParseResult *)local_550,&local_410,&local_b8,(Property *)(p_Var23 + 2),
                 (string *)local_3c8,
                 (TypedAttribute<tinyusdz::Animatable<tinyusdz::value::AssetPath>_> *)
                 local_188._24_8_);
      if (_local_3c8 != (texcoord2f)local_3b8) {
        operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      iVar13 = 0;
      if ((local_550._0_8_ & 0xfffffffd) == 0) {
        iVar13 = 3;
LAB_00235780:
        bVar32 = false;
      }
      else {
        bVar32 = true;
        if (local_550._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3c8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3c8,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"():",3);
          poVar14 = (ostream *)
                    ::std::ostream::operator<<
                              ((Animatable<tinyusdz::value::texcoord2f> *)local_3c8,0xfed);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          local_4e0 = (undefined1  [8])local_4d0;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4e0,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[12],std::__cxx11::string>
                    ((string *)local_510,(fmt *)local_4e0,(string *)"inputs:file",
                     (char (*) [12])(local_550 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
          poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,(char *)local_510,(long)local_508);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
          if (local_510 != (undefined1  [8])&local_500) {
            operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
          }
          if (local_4e0 != (undefined1  [8])local_4d0) {
            operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
          }
          if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ptVar15 = (texcoord2f *)
                      ::std::__cxx11::string::_M_append
                                (local_4e0,(ulong)(local_520->_metas).interpolation);
            tVar6 = (texcoord2f)(ptVar15 + 2);
            if (*ptVar15 == tVar6) {
              local_500._M_allocated_capacity = *(undefined8 *)tVar6;
              tVar5 = ptVar15[3];
              local_500._M_local_buf[8] = tVar5.s._0_1_;
              local_500._M_local_buf[9] = tVar5.s._1_1_;
              local_500._M_local_buf[10] = tVar5.s._2_1_;
              local_500._11_5_ = tVar5._3_5_;
              local_510 = (undefined1  [8])&local_500;
            }
            else {
              local_500._M_allocated_capacity = *(undefined8 *)tVar6;
              local_510 = (undefined1  [8])*ptVar15;
            }
            local_508 = ptVar15[1];
            *ptVar15 = tVar6;
            ptVar15[1].s = 0.0;
            ptVar15[1].t = 0.0;
            *(undefined1 *)&ptVar15[2].s = 0;
            ::std::__cxx11::string::operator=((string *)local_520,(string *)local_510);
            if (local_510 != (undefined1  [8])&local_500) {
              operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
            }
            if (local_4e0 != (undefined1  [8])local_4d0) {
              operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
          ::std::ios_base::~ios_base(local_358);
          iVar13 = 1;
          goto LAB_00235780;
        }
      }
      if (local_550._8_8_ != (long)local_540 + 8) {
        operator_delete((void *)local_550._8_8_,
                        CONCAT53(local_540._11_5_,
                                 CONCAT12(local_540[10],CONCAT11(local_540[9],local_540[8]))) + 1);
      }
      if (bVar32) {
        local_1e8._0_8_ = local_1e8 + 0x10;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1e8,*(long *)(p_Var23 + 1),
                   (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
        local_240._0_8_ = &local_230;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"inputs:st","");
        uVar11 = local_1e8._8_8_;
        uVar18 = local_240._8_8_;
        local_4d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_4d0 + 8);
        local_4d0._0_8_ = (char *)0x0;
        local_4d0[8] = '\0';
        __n = (anon_struct_8_0_00000001_for___align)local_1e8._8_8_;
        if ((ulong)local_240._8_8_ < (ulong)local_1e8._8_8_) {
          __n = (anon_struct_8_0_00000001_for___align)local_240._8_8_;
        }
        if (__n == (anon_struct_8_0_00000001_for___align)0x0) {
          bVar32 = true;
        }
        else {
          iVar13 = bcmp((void *)local_1e8._0_8_,(void *)local_240._0_8_,(size_t)__n);
          bVar32 = iVar13 == 0;
        }
        p_Var31 = local_490;
        if ((bool)(bVar32 ^ 1U | uVar11 != uVar18)) {
          local_4e0._0_4_ = 1;
        }
        else {
          if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
            local_4e0._0_4_ = 7;
            local_550._0_8_ = local_540;
            local_510._0_4_ = 8.26766e-44;
            local_510._4_4_ = 0.0;
            local_550._0_8_ = ::std::__cxx11::string::_M_create((ulong *)local_550,(ulong)local_510)
            ;
            local_540._0_8_ = local_510;
            *(undefined8 *)local_550._0_8_ = 0x79747265706f7250;
            *(undefined8 *)(local_550._0_8_ + 8) = 0x7473756d207d7b20;
            *(undefined8 *)(local_550._0_8_ + 0x10) = 0x7274744120656220;
            *(undefined8 *)(local_550._0_8_ + 0x18) = 0x62202c6574756269;
            *(undefined8 *)(local_550._0_8_ + 0x20) = 0x616c636564207475;
            *(undefined8 *)(local_550._0_8_ + 0x28) = 0x5220736120646572;
            *(char *)(local_550._0_8_ + 0x2b) = ' ';
            *(char *)(local_550._0_8_ + 0x2c) = 'a';
            *(char *)(local_550._0_8_ + 0x2d) = 's';
            *(char *)(local_550._0_8_ + 0x2e) = ' ';
            *(char *)(local_550._0_8_ + 0x2f) = 'R';
            *(char *)(local_550._0_8_ + 0x30) = 'e';
            *(char *)(local_550._0_8_ + 0x31) = 'l';
            *(char *)(local_550._0_8_ + 0x32) = 'a';
            *(char *)(local_550._0_8_ + 0x33) = 't';
            *(char *)(local_550._0_8_ + 0x34) = 'i';
            *(char *)(local_550._0_8_ + 0x35) = 'o';
            *(char *)(local_550._0_8_ + 0x36) = 'n';
            *(char *)(local_550._0_8_ + 0x37) = 'h';
            *(char *)(local_550._0_8_ + 0x38) = 'i';
            *(char *)(local_550._0_8_ + 0x39) = 'p';
            *(char *)(local_550._0_8_ + 0x3a) = '.';
            local_550._8_8_ = local_510;
            *(char *)(local_550._0_8_ + (long)local_510) = '\0';
            fmt::format<std::__cxx11::string>
                      ((string *)local_3c8,(fmt *)local_550,(string *)local_240,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_510);
            ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_3c8);
            if (_local_3c8 != (texcoord2f)local_3b8) {
              operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
            }
            uVar18 = local_540._0_8_;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_550._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540) goto LAB_00236803;
          }
          else {
            Attribute::type_name_abi_cxx11_((string *)(local_210 + 8),&local_4b0->_attrib);
            _local_3c8 = (texcoord2f)local_3b8;
            local_3b8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x64726f6f43786574;
            local_3b8[8] = '2';
            local_3b8[9] = 'f';
            uStack_3c0._0_1_ = true;
            uStack_3c0._1_1_ = false;
            uStack_3be = 0;
            fStack_3bc = 0.0;
            local_3b8[10] = '\0';
            if (local_210._16_8_ == 10) {
              bVar32 = *(short *)(local_210._8_8_ + 8) == 0x6632 &&
                       *(size_type *)local_210._8_8_ == 0x64726f6f43786574;
            }
            else {
              bVar32 = false;
            }
            bVar33 = true;
            if (!bVar32) {
              local_1e8._32_8_ = &local_1b8;
              local_1b8._4_2_ = 0x3274;
              local_1b8.has_value_ = true;
              local_1b8._1_3_ = 0x616f6c;
              local_1e8._40_8_ = 6;
              local_1b8._6_1_ = 0;
              if (local_210._16_8_ == 6) {
                bVar33 = *(short *)(local_210._8_8_ + 4) == 0x3274 &&
                         *(int *)local_210._8_8_ == 0x616f6c66;
              }
              else {
                bVar33 = false;
              }
            }
            if ((!bVar32) &&
               ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_1e8._32_8_ != &local_1b8)) {
              operator_delete((void *)local_1e8._32_8_,
                              CONCAT17(local_1b8._7_1_,
                                       CONCAT16(local_1b8._6_1_,
                                                CONCAT24(local_1b8._4_2_,local_1b8._0_4_))) + 1);
            }
            if (_local_3c8 != (texcoord2f)local_3b8) {
              operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
            }
            if (bVar33) {
              p_Var26 = p_Var23[6]._M_parent;
              p_Var4 = p_Var23[6]._M_left;
              if (p_Var4 != p_Var26) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           local_188._8_8_,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var23[6]._M_parent);
              }
              iVar13 = *(int *)((long)&p_Var23[0x17]._M_parent + 4);
              if (iVar13 == 1) {
                local_218 = p_Var4;
                if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
                  if (p_Var23[4]._M_right == (_Base_ptr)0x0) {
                    bVar32 = false;
                  }
                  else {
                    iVar13 = (**(code **)p_Var23[4]._M_right)();
                    bVar32 = iVar13 == 4;
                  }
                  if ((!bVar32) && ((p_Var23[5]._M_color & _S_black) == _S_red)) goto LAB_00235cc4;
                  (local_438->st)._blocked = true;
LAB_00235e55:
                  local_4b4 = 0;
LAB_00235e60:
                  local_4f0 = 0;
                  uStack_4ef = 0;
                  local_4e8 = false;
                  local_500._M_allocated_capacity = 0;
                  local_500._M_local_buf[8] = '\0';
                  local_500._M_local_buf[9] = '\0';
                  local_500._M_local_buf[10] = '\0';
                  local_500._11_5_ = 0;
                  local_508 = (texcoord2f)((ulong)local_508 & 0xffffffffffff0000);
                  local_510._0_4_ = 0.0;
                  local_510._4_4_ = 0.0;
                  this_00 = (PrimVar *)&p_Var23[4]._M_parent;
                  local_440 = p_Var26;
                  if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
                    local_49c = 0;
LAB_0023652f:
                    if ((char)p_Var23[5]._M_color == _S_red) {
                      if (p_Var23[4]._M_right == (_Base_ptr)0x0) {
LAB_00236550:
                        if (p_Var23[4]._M_right != (_Base_ptr)0x0) {
                          iVar13 = (**(code **)p_Var23[4]._M_right)();
                          if (iVar13 == 1) goto LAB_00236563;
                        }
                        goto LAB_00236572;
                      }
                      iVar13 = (**(code **)p_Var23[4]._M_right)();
                      if (iVar13 != 0) goto LAB_00236550;
LAB_00236563:
                      bVar32 = false;
                      uVar27 = local_49c;
                    }
                    else {
LAB_00236572:
                      primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                                ((optional<tinyusdz::value::texcoord2f> *)local_3c8,this_00);
                      cVar10 = local_3c8[0];
                      if (local_3c8[0] == '\x01') {
                        local_510[4] = uStack_3c0._0_1_;
                        local_510[5] = uStack_3c0._1_1_;
                        local_510._0_4_ = fStack_3c4;
                        local_510._6_2_ = uStack_3be;
                        local_508.s._0_2_ = 1;
                        uVar27 = local_49c;
                      }
                      else {
                        local_4e0._0_4_ = 8;
                        local_488._M_dataplus._M_p._0_7_ = 0x54;
                        local_488._M_dataplus._M_p._7_1_ = 0;
                        local_550._0_8_ = local_540;
                        local_448 = this_00;
                        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)::std::__cxx11::string::_M_create
                                               ((ulong *)local_550,(ulong)&local_488);
                        tVar6.t._3_1_ = local_488._M_dataplus._M_p._7_1_;
                        tVar6._0_7_ = local_488._M_dataplus._M_p._0_7_;
                        local_550._0_8_ = paVar20;
                        local_540._0_8_ = tVar6;
                        memcpy(paVar20,
                               "Internal error. Invalid attribute value? get_value<{}> failed. Attribute has type {}"
                               ,0x54);
                        paVar20->_M_local_buf[(long)tVar6] = '\0';
                        local_488._M_dataplus._M_p._0_7_ = SUB87(&local_488.field_2,0);
                        local_488._M_dataplus._M_p._7_1_ =
                             (undefined1)((ulong)&local_488.field_2 >> 0x38);
                        local_488.field_2._M_local_buf[0] = 't';
                        local_488.field_2._M_allocated_capacity._1_6_ = 0x726f6f437865;
                        local_488.field_2._M_local_buf[7] = 'd';
                        local_488.field_2._8_2_ = 0x6632;
                        local_488._M_string_length._0_7_ = 10;
                        local_488._M_string_length._7_1_ = '\0';
                        local_488.field_2._M_local_buf[10] = '\0';
                        local_550._8_8_ = tVar6;
                        primvar::PrimVar::type_name_abi_cxx11_(&local_430,local_448);
                        fmt::format<std::__cxx11::string,std::__cxx11::string>
                                  ((string *)local_3c8,(fmt *)local_550,&local_488,&local_430,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)args_1);
                        ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_3c8);
                        if (_local_3c8 != (texcoord2f)local_3b8) {
                          operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                        }
                        uVar27 = local_49c;
                        if (local_430._M_dataplus._M_p != (pointer)((long)&local_430 + 0x10)) {
                          operator_delete(local_430._M_dataplus._M_p,
                                          local_430.field_2._M_allocated_capacity + 1);
                        }
                        paVar20 = &local_488.field_2;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT17(local_488._M_dataplus._M_p._7_1_,
                                        local_488._M_dataplus._M_p._0_7_) != paVar20) {
                          operator_delete((undefined1 *)
                                          CONCAT17(local_488._M_dataplus._M_p._7_1_,
                                                   local_488._M_dataplus._M_p._0_7_),
                                          CONCAT17(local_488.field_2._M_local_buf[7],
                                                   CONCAT61(local_488.field_2._M_allocated_capacity.
                                                            _1_6_,local_488.field_2._M_local_buf[0])
                                                  ) + 1);
                          paVar20 = extraout_RAX_01;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_550._0_8_ !=
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_540) {
                          operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                          paVar20 = extraout_RAX_02;
                        }
                        local_4b4 = (uint)CONCAT71((int7)((ulong)paVar20 >> 8),1);
                      }
                      cVar12 = (char)uVar27;
                      bVar32 = true;
                      bVar33 = false;
                      if (cVar10 == '\0') {
                        bVar32 = false;
                        goto LAB_00236757;
                      }
                    }
                    cVar12 = (char)uVar27;
                    if ((cVar12 != '\0') || (bVar33 = true, bVar32)) {
                      nonstd::optional_lite::
                      optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::operator=
                                ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)
                                 local_220,(Animatable<tinyusdz::value::texcoord2f> *)local_510);
                      bVar33 = true;
                    }
                  }
                  else {
                    local_540[0x10] = '\0';
                    local_540._17_7_ = 0;
                    local_528 = false;
                    local_540._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_540[8] = '\0';
                    local_540[9] = '\0';
                    local_540[10] = '\0';
                    local_540._11_5_ = 0;
                    local_550._8_8_ = local_550._8_8_ & 0xffffffffffff0000;
                    local_550._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    bVar32 = primvar::PrimVar::is_valid(this_00);
                    local_448 = this_00;
                    if (bVar32) {
                      if ((char)p_Var23[5]._M_color == _S_red) {
                        if (p_Var23[4]._M_right == (_Base_ptr)0x0) {
LAB_00235ee5:
                          if (p_Var23[4]._M_right != (_Base_ptr)0x0) {
                            iVar13 = (**(code **)p_Var23[4]._M_right)();
                            if (iVar13 == 1) goto LAB_00235ef8;
                          }
                          goto LAB_00235f5e;
                        }
                        iVar13 = (**(code **)p_Var23[4]._M_right)();
                        if (iVar13 != 0) goto LAB_00235ee5;
LAB_00235ef8:
                        cVar12 = '\0';
                      }
                      else {
LAB_00235f5e:
                        primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                                  ((optional<tinyusdz::value::texcoord2f> *)&local_430,this_00);
                        cVar12 = local_430._M_dataplus._M_p._0_1_;
                        if (local_430._M_dataplus._M_p._0_1_ == true) {
                          local_550._0_8_ =
                               CONCAT44((undefined4)local_430._M_string_length,
                                        local_430._M_dataplus._M_p._4_4_);
                          local_550._8_2_ = 1;
                          cVar12 = '\x01';
                        }
                      }
                      if (p_Var23[5]._M_left == p_Var23[5]._M_parent) {
                        if (cVar12 == '\0') goto LAB_00235f1a;
                      }
                      else {
                        lVar25 = 0;
                        uVar28 = 0;
                        do {
                          if ((char)p_Var23[6]._M_color == _S_black) {
                            tinyusdz::value::TimeSamples::update
                                      ((TimeSamples *)&p_Var23[5]._M_parent);
                          }
                          p_Var31 = p_Var23[5]._M_parent;
                          if (*(char *)((long)&p_Var31[1]._M_color + lVar25) == '\x01') {
                            TypedTimeSamples<tinyusdz::value::texcoord2f>::add_blocked_sample
                                      ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_540,
                                       *(double *)((long)&p_Var31->_M_color + lVar25));
                          }
                          else {
                            tinyusdz::value::Value::get_value<tinyusdz::value::texcoord2f>
                                      (&local_164,(Value *)((long)&p_Var31->_M_parent + lVar25),
                                       false);
                            bVar32 = local_164.has_value_;
                            local_430._M_dataplus._M_p._0_1_ = local_164.has_value_;
                            if (local_164.has_value_ == true) {
                              local_430._M_dataplus._M_p._4_4_ = local_164.contained._0_4_;
                              local_430._M_string_length._0_4_ = local_164.contained._4_4_;
                              TypedTimeSamples<tinyusdz::value::texcoord2f>::add_sample
                                        ((TypedTimeSamples<tinyusdz::value::texcoord2f> *)local_540,
                                         *(double *)((long)&p_Var31->_M_color + lVar25),
                                         (texcoord2f *)((long)&local_430 + 4));
                            }
                            else {
                              local_488._M_dataplus._M_p._7_1_ = 0;
                              local_488._M_string_length._0_7_ = 0;
                              local_488._M_string_length._7_1_ = '\0';
                              local_488.field_2._M_local_buf[0] = '\0';
                              local_488.field_2._M_allocated_capacity._1_6_ = 0;
                              local_450 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                           *)0x0;
                              local_458 = (Animatable<tinyusdz::value::texcoord2f> *)0x0;
                              local_460 = 0;
                              local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)0x0;
                              local_498 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                           *)0x0;
                            }
                            if (bVar32 == false) goto LAB_00236298;
                          }
                          uVar28 = uVar28 + 1;
                          lVar25 = lVar25 + 0x28;
                        } while (uVar28 < (ulong)(((long)p_Var23[5]._M_left -
                                                   (long)p_Var23[5]._M_parent >> 3) *
                                                 -0x3333333333333333));
                      }
                      uVar7 = local_540._17_7_;
                      local_488._M_string_length._7_1_ = (undefined1)local_550._8_8_;
                      local_488.field_2._M_local_buf[0] = SUB81(local_550._8_8_,1);
                      local_488._M_dataplus._M_p._7_1_ = (undefined1)local_550._0_8_;
                      local_488._M_string_length._0_7_ = SUB87(local_550._0_8_,1);
                      local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_540._0_8_;
                      local_460 = CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8])));
                      local_458 = (Animatable<tinyusdz::value::texcoord2f> *)
                                  CONCAT71(local_540._17_7_,local_540[0x10]);
                      local_540._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      local_540[8] = '\0';
                      local_540[9] = '\0';
                      local_540[10] = '\0';
                      local_540._11_5_ = 0;
                      local_540[0x10] = '\0';
                      local_540._17_7_ = 0;
                      local_498 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                   *)CONCAT71(uVar7,1);
                      local_450 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                   *)CONCAT71(uVar7,local_528);
                    }
                    else {
LAB_00235f1a:
                      local_488._M_dataplus._M_p._7_1_ = 0;
                      local_488._M_string_length._0_7_ = 0;
                      local_488._M_string_length._7_1_ = '\0';
                      local_488.field_2._M_local_buf[0] = '\0';
                      local_488.field_2._M_allocated_capacity._1_6_ = 0;
                      local_498 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                   *)0x0;
                      local_450 = (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::UsdUVTexture::SourceColorSpace>_>
                                   *)0x0;
                      local_458 = (Animatable<tinyusdz::value::texcoord2f> *)0x0;
                      local_460 = 0;
                      local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0;
                    }
LAB_00236298:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      operator_delete((void *)local_540._0_8_,
                                      CONCAT71(local_540._17_7_,local_540[0x10]) - local_540._0_8_);
                    }
                    uVar18 = local_3b8._0_8_;
                    local_3c8[0] = (char)local_498;
                    args_1 = local_458;
                    if (((ulong)local_498 & 1) != 0) {
                      local_3b8[1] = local_488.field_2._M_local_buf[0];
                      local_3b8[0] = local_488._M_string_length._7_1_;
                      local_3b8._2_6_ = SUB86(uVar18,2);
                      uStack_3c0 = (undefined2)
                                   CONCAT71((undefined7)local_488._M_string_length,
                                            local_488._M_dataplus._M_p._7_1_);
                      uStack_3be = (undefined2)((uint7)(undefined7)local_488._M_string_length >> 8);
                      fStack_3bc = (float)((uint7)(undefined7)local_488._M_string_length >> 0x18);
                      local_3b8[8] = SUB81(local_468,0);
                      local_3b8[9] = (undefined1)((ulong)local_468 >> 8);
                      local_3b8[10] = (undefined1)((ulong)local_468 >> 0x10);
                      local_3b8._11_5_ = (undefined5)((ulong)local_468 >> 0x18);
                      local_3a8 = (undefined1)local_460;
                      uStack_3a7 = (undefined7)((ulong)local_460 >> 8);
                      local_3a0 = SUB81(local_458,0);
                      uStack_39f = (undefined7)((ulong)local_458 >> 8);
                      local_398 = SUB81(local_450,0);
                      args_1 = (Animatable<tinyusdz::value::texcoord2f> *)0x0;
                      local_460 = 0;
                      local_468 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x0;
                    }
                    local_458 = args_1;
                    if (((ulong)local_498 & 1) == 0) {
                      local_4e0._0_4_ = 8;
                      local_488._M_dataplus._M_p._0_7_ = SUB87(&local_488.field_2,0);
                      local_488._M_dataplus._M_p._7_1_ =
                           (undefined1)((ulong)&local_488.field_2 >> 0x38);
                      local_430._M_dataplus._M_p._0_1_ = true;
                      local_430._M_dataplus._M_p._1_3_ = 0;
                      local_430._M_dataplus._M_p._4_4_ = (anon_struct_4_0_00000001_for___align)0x0;
                      pvVar19 = (void *)::std::__cxx11::string::_M_create
                                                  ((ulong *)&local_488,(ulong)&local_430);
                      local_488._M_dataplus._M_p._0_7_ = SUB87(pvVar19,0);
                      local_488._M_dataplus._M_p._7_1_ = (undefined1)((ulong)pvVar19 >> 0x38);
                      lVar25 = CONCAT44(local_430._M_dataplus._M_p._4_4_,
                                        local_430._M_dataplus._M_p._0_4_);
                      local_488.field_2._M_local_buf[0] = (char)local_430._M_dataplus._M_p._0_4_;
                      local_488.field_2._M_allocated_capacity._1_6_ =
                           (undefined6)((ulong)lVar25 >> 8);
                      local_488.field_2._M_local_buf[7] = SUB41(local_430._M_dataplus._M_p._4_4_,3);
                      uVar9 = local_488.field_2._M_local_buf[7];
                      memcpy(pvVar19,
                             "Converting timeSamples Attribute data failed for `{}`. Guess TimeSamples have values with different type(expected is `{}`)?"
                             ,0x7b);
                      local_488._M_string_length._0_7_ = (undefined7)lVar25;
                      *(undefined1 *)((long)pvVar19 + lVar25) = 0;
                      local_430._M_dataplus._M_p = (pointer)((long)&local_430 + 0x10);
                      local_430.field_2._M_allocated_capacity = 0x64726f6f43786574;
                      local_430.field_2._8_2_ = 0x6632;
                      local_430._M_string_length._0_4_ = 10;
                      local_430._M_string_length._4_4_ = 0;
                      local_430.field_2._M_local_buf[10] = '\0';
                      local_488._M_string_length._7_1_ = uVar9;
                      fmt::format<std::__cxx11::string,std::__cxx11::string>
                                ((string *)local_550,(fmt *)&local_488,(string *)local_1e8,
                                 &local_430,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)args_1);
                      ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_550);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_550._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_540) {
                        operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                      }
                      if (local_430._M_dataplus._M_p != (pointer)((long)&local_430 + 0x10)) {
                        operator_delete(local_430._M_dataplus._M_p,
                                        local_430.field_2._M_allocated_capacity + 1);
                      }
                      this_00 = local_448;
                      paVar20 = &local_488.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT17(local_488._M_dataplus._M_p._7_1_,
                                      local_488._M_dataplus._M_p._0_7_) != paVar20) {
                        operator_delete((undefined1 *)
                                        CONCAT17(local_488._M_dataplus._M_p._7_1_,
                                                 local_488._M_dataplus._M_p._0_7_),
                                        CONCAT17(local_488.field_2._M_local_buf[7],
                                                 CONCAT61(local_488.field_2._M_allocated_capacity.
                                                          _1_6_,local_488.field_2._M_local_buf[0]))
                                        + 1);
                        paVar20 = extraout_RAX;
                      }
                      uVar18 = CONCAT71((int7)((ulong)paVar20 >> 8),1);
                      local_4b4 = (uint)uVar18;
                    }
                    else {
                      local_508.s._0_2_ = local_3b8._0_2_;
                      local_510._2_2_ = uStack_3be;
                      local_510[0] = uStack_3c0._0_1_;
                      local_510[1] = uStack_3c0._1_1_;
                      local_510._4_4_ = fStack_3bc;
                      pvVar17 = ::std::
                                vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                ::operator=((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                             *)&local_500,
                                            (vector<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::texcoord2f>::Sample>_>
                                             *)(local_3b8 + 8));
                      uVar18 = CONCAT71((int7)((ulong)pvVar17 >> 8),local_398);
                      local_4e8 = (bool)local_398;
                      this_00 = local_448;
                    }
                    if ((local_3c8[0] == '\x01') &&
                       (pvVar19 = (void *)CONCAT53(local_3b8._11_5_,
                                                   CONCAT12(local_3b8[10],
                                                            CONCAT11(local_3b8[9],local_3b8[8]))),
                       pvVar19 != (void *)0x0)) {
                      operator_delete(pvVar19,CONCAT71(uStack_39f,local_3a0) - (long)pvVar19);
                      uVar18 = extraout_RAX_00;
                    }
                    local_49c = (undefined4)CONCAT71((int7)((ulong)uVar18 >> 8),1);
                    bVar32 = false;
                    cVar12 = '\0';
                    bVar33 = false;
                    if (((ulong)local_498 & 1) != 0) goto LAB_0023652f;
                  }
LAB_00236757:
                  if ((void *)local_500._M_allocated_capacity != (void *)0x0) {
                    operator_delete((void *)local_500._M_allocated_capacity,
                                    CONCAT71(uStack_4ef,local_4f0) - local_500._0_8_);
                  }
                  p_Var31 = local_490;
                  if (bVar33) goto LAB_0023677f;
                }
                else {
LAB_00235cc4:
                  if (p_Var23[3]._M_color != _S_black) goto LAB_00235e55;
                  bVar32 = primvar::PrimVar::is_timesamples((PrimVar *)&p_Var23[4]._M_parent);
                  if (bVar32) {
                    local_4e0._0_4_ = 4;
                    local_510._0_4_ = 7.56701e-44;
                    local_510._4_4_ = 0.0;
                    local_550._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_540;
                    local_550._0_8_ =
                         ::std::__cxx11::string::_M_create((ulong *)local_550,(ulong)local_510);
                    local_540._0_8_ = local_510;
                    *(undefined8 *)local_550._0_8_ = 0x706d6153656d6954;
                    *(undefined8 *)(local_550._0_8_ + 8) = 0x65756c617620656c;
                    *(undefined8 *)(local_550._0_8_ + 0x10) = 0x6973736120736920;
                    *(undefined8 *)(local_550._0_8_ + 0x18) = 0x206f742064656e67;
                    *(undefined8 *)(local_550._0_8_ + 0x20) = 0x6d726f66696e7560;
                    *(undefined8 *)(local_550._0_8_ + 0x28) = 0x7265706f72702060;
                    *(char *)(local_550._0_8_ + 0x2e) = 'e';
                    *(char *)(local_550._0_8_ + 0x2f) = 'r';
                    *(char *)(local_550._0_8_ + 0x30) = 't';
                    *(char *)(local_550._0_8_ + 0x31) = 'y';
                    *(char *)(local_550._0_8_ + 0x32) = ' ';
                    *(char *)(local_550._0_8_ + 0x33) = '`';
                    *(char *)(local_550._0_8_ + 0x34) = '{';
                    *(char *)(local_550._0_8_ + 0x35) = '}';
                    local_550._8_8_ = local_510;
                    *(char *)(local_550._0_8_ + (long)local_510) = '\0';
                    fmt::format<std::__cxx11::string>
                              ((string *)local_3c8,(fmt *)local_550,(string *)local_240,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_510);
                    ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_3c8);
                    if (_local_3c8 != (texcoord2f)local_3b8) {
                      operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540) {
                      operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                    }
                    goto LAB_002367de;
                  }
                  poVar16 = primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>
                                      ((optional<tinyusdz::value::texcoord2f> *)local_3c8,
                                       (PrimVar *)&p_Var23[4]._M_parent);
                  local_4b4 = (uint)CONCAT71((int7)((ulong)poVar16 >> 8),local_3c8[0]);
                  if (local_3c8[0] == '\x01') {
                    local_3a8 = Varying;
                    uStack_3a7 = 0;
                    local_3a0 = false;
                    local_3b8._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
                    local_3b8[8] = '\0';
                    local_3b8[9] = '\0';
                    local_3b8[10] = '\0';
                    local_3b8._11_5_ = 0;
                    local_3c8 = (undefined1  [4])fStack_3c4;
                    fStack_3c4 = (float)(CONCAT26(uStack_3be,CONCAT24(uStack_3c0,fStack_3c4)) >>
                                        0x20);
                    uStack_3c0._0_1_ = true;
                    uStack_3c0._1_1_ = false;
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>>::operator=
                              ((optional<tinyusdz::Animatable<tinyusdz::value::texcoord2f>> *)
                               local_220,(Animatable<tinyusdz::value::texcoord2f> *)local_3c8);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_3b8._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0) {
                      uVar28 = CONCAT71(uStack_3a7,local_3a8) - local_3b8._0_8_;
                      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_3b8._0_8_;
LAB_00236204:
                      operator_delete(paVar20,uVar28);
                    }
                  }
                  else {
                    local_4e0._0_4_ = 3;
                    local_510._0_4_ = 8.40779e-44;
                    local_510._4_4_ = 0.0;
                    local_550._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_540;
                    local_440 = p_Var26;
                    local_550._0_8_ =
                         ::std::__cxx11::string::_M_create((ulong *)local_550,(ulong)local_510);
                    local_540._0_8_ = local_510;
                    *(undefined8 *)local_550._0_8_ = 0x6b6361626c6c6146;
                    *(undefined8 *)(local_550._0_8_ + 8) = 0x64656c696146202e;
                    *(undefined8 *)(local_550._0_8_ + 0x10) = 0x72746572206f7420;
                    *(undefined8 *)(local_550._0_8_ + 0x18) = 0x6c61762065766569;
                    *(undefined8 *)(local_550._0_8_ + 0x20) = 0x2068746977206575;
                    *(undefined8 *)(local_550._0_8_ + 0x28) = 0x6574736575716572;
                    *(undefined8 *)(local_550._0_8_ + 0x2c) = 0x7974206465747365;
                    *(undefined8 *)(local_550._0_8_ + 0x34) = 0x2e607d7b60206570;
                    local_550._8_8_ = local_510;
                    *(char *)(local_550._0_8_ + (long)local_510) = '\0';
                    local_510 = (undefined1  [8])&local_500;
                    local_500._M_allocated_capacity = 0x64726f6f43786574;
                    local_500._M_local_buf[8] = '2';
                    local_500._M_local_buf[9] = 'f';
                    local_508.s = 1.4013e-44;
                    local_508.t = 0.0;
                    local_500._M_local_buf[10] = '\0';
                    fmt::format<std::__cxx11::string>
                              ((string *)local_3c8,(fmt *)local_550,(string *)local_510,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x64726f6f43786574);
                    ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_3c8);
                    if (_local_3c8 != (texcoord2f)local_3b8) {
                      operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                    }
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    p_Var26 = local_440;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540) {
                      uVar28 = local_540._0_8_ + 1;
                      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_550._0_8_;
                      goto LAB_00236204;
                    }
                  }
                  cVar12 = (char)local_4b4;
                  local_4b4 = local_4b4 ^ 1;
                  if (cVar12 == '\x01') goto LAB_00235e60;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._8_8_ != &local_1f8) {
                  operator_delete((void *)local_210._8_8_,local_1f8._M_allocated_capacity + 1);
                }
                if (((char)local_4b4 != '\0') ||
                   (local_4d8 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_4d0 + 8))) goto LAB_00236803;
                uVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)CONCAT71(local_4d0._9_7_,local_4d0[8]);
                paVar20 = local_4d8;
                goto LAB_002367fb;
              }
              if (iVar13 == 0) {
LAB_00235aee:
                (local_438->st)._empty = true;
              }
              else {
                bVar32 = false;
                cVar12 = '\0';
                local_440 = p_Var26;
                local_218 = p_Var4;
LAB_0023677f:
                if (local_218 == local_440) {
                  if ((cVar12 == '\0') && (!bVar32)) {
                    args_1 = (Animatable<tinyusdz::value::texcoord2f> *)0x25;
                    ::std::__cxx11::string::_M_replace
                              ((ulong)&local_4d8,0,(char *)local_4d0._0_8_,0x400008);
                    local_4e0._0_4_ = 8;
                    goto LAB_002367de;
                  }
                }
                else if ((cVar12 == '\0') && (!bVar32)) goto LAB_00235aee;
              }
              AttrMetas::operator=((AttrMetas *)local_210._0_8_,(AttrMetas *)(p_Var23 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_410,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240);
              local_4e0 = (undefined1  [8])((ulong)local_4e0 & 0xffffffff00000000);
            }
            else {
              local_4e0._0_4_ = 3;
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_3c8);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b8,"Property type mismatch. ",0x18);
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3b8,(char *)local_240._0_8_,local_240._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," expects type `",0xf);
              local_540._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x64726f6f43786574;
              local_540[8] = '2';
              local_540[9] = 'f';
              local_550._8_4_ = 1.4013e-44;
              local_550._12_4_ = 0.0;
              local_540[10] = '\0';
              local_550._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_540;
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_540)->_M_local_buf,10);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"` but defined as type `",0x17);
              poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(char *)local_210._8_8_,local_210._16_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"`",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_4d8,(string *)local_550);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_3c8);
              ::std::ios_base::~ios_base(local_348);
            }
LAB_002367de:
            uVar18 = local_1f8._M_allocated_capacity;
            paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_210._8_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._8_8_ == &local_1f8) goto LAB_00236803;
          }
LAB_002367fb:
          operator_delete(paVar20,uVar18 + 1);
        }
LAB_00236803:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._0_8_ != &local_230) {
          operator_delete((void *)local_240._0_8_,local_230._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        iVar13 = 0;
        if (((ulong)local_4e0 & 0xfffffffd) == 0) {
          iVar13 = 3;
LAB_00236a7b:
          bVar32 = false;
        }
        else {
          bVar32 = true;
          if (local_4e0._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3c8,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"():",3);
            poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xfef);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
            local_510 = (undefined1  [8])&local_500;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_510,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[10],std::__cxx11::string>
                      ((string *)local_550,(fmt *)local_510,(string *)"inputs:st",
                       (char (*) [10])&local_4d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
            poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3c8,(char *)local_550._0_8_,local_550._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540) {
              operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
            }
            if (local_510 != (undefined1  [8])&local_500) {
              operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
            }
            if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar21 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_510,(ulong)(local_520->_metas).interpolation);
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar21 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar21 == paVar20) {
                local_540._0_8_ = paVar20->_M_allocated_capacity;
                uVar18 = puVar21[3];
                local_540[8] = (undefined1)uVar18;
                local_540[9] = (undefined1)((ulong)uVar18 >> 8);
                local_540[10] = (undefined1)((ulong)uVar18 >> 0x10);
                local_540._11_5_ = (undefined5)((ulong)uVar18 >> 0x18);
                local_550._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_540;
              }
              else {
                local_540._0_8_ = paVar20->_M_allocated_capacity;
                local_550._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar21;
              }
              local_550._8_8_ = *(texcoord2f *)(puVar21 + 1);
              *puVar21 = paVar20;
              puVar21[1] = 0;
              *(undefined1 *)(puVar21 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)local_520,(string *)local_550);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              if (local_510 != (undefined1  [8])&local_500) {
                operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
            ::std::ios_base::~ios_base(local_358);
            iVar13 = 1;
            goto LAB_00236a7b;
          }
        }
        if (local_4d8 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_4d0 + 8)) {
          operator_delete(local_4d8,CONCAT71(local_4d0._9_7_,local_4d0[8]) + 1);
        }
        if (bVar32) {
          p_Var26 = p_Var23 + 1;
          iVar13 = ::std::__cxx11::string::compare((char *)p_Var26);
          if (iVar13 == 0) {
            _local_3c8 = (texcoord2f)local_3b8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3c8,"inputs:sourceColorSpace","");
            cVar22 = ::std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_410,(key_type *)local_3c8);
            if (_local_3c8 != (texcoord2f)local_3b8) {
              operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
            }
            iVar13 = 3;
            if ((_Rb_tree_header *)cVar22._M_node != &local_410._M_t._M_impl.super__Rb_tree_header)
            goto LAB_00238aa4;
            if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              _local_3c8 = (texcoord2f)local_3b8;
              uStack_3c0._0_1_ = false;
              uStack_3c0._1_1_ = false;
              uStack_3be = 0;
              fStack_3bc = 0.0;
              local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
            }
            else {
              Attribute::type_name_abi_cxx11_((string *)local_3c8,&local_4b0->_attrib);
            }
            local_550._0_8_ = local_540;
            local_550._8_4_ = 7.00649e-45;
            local_550._12_4_ = 0.0;
            local_540._0_6_ = 0x6e656b6f74;
            if (CONCAT44(fStack_3bc,CONCAT22(uStack_3be,uStack_3c0)) == 5) {
              iVar13 = bcmp((void *)_local_3c8,local_540,5);
              if ((iVar13 != 0) ||
                 (uVar3 = *(uint *)((long)&p_Var23[0x17]._M_parent + 4), 1 < uVar3))
              goto LAB_00237138;
              if (_local_3c8 != (texcoord2f)local_3b8) {
                operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
              }
              if (uVar3 == 0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,"[warn]",6);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"():",3);
                poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xff2);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,"No value assigned to `",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,"inputs:sourceColorSpace",0x17);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3c8,"` token attribute. Set default token value.",0x2b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"\n",1);
                if (local_4a8 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar21 = (undefined8 *)
                            ::std::__cxx11::string::_M_append
                                      (local_510,(ulong)(local_520->_metas).interpolation);
                  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(puVar21 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar21 == paVar20) {
                    local_540._0_8_ = paVar20->_M_allocated_capacity;
                    uVar18 = puVar21[3];
                    local_540[8] = (undefined1)uVar18;
                    local_540[9] = (undefined1)((ulong)uVar18 >> 8);
                    local_540[10] = (undefined1)((ulong)uVar18 >> 0x10);
                    local_540._11_5_ = (undefined5)((ulong)uVar18 >> 0x18);
                    local_550._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_540;
                  }
                  else {
                    local_540._0_8_ = paVar20->_M_allocated_capacity;
                    local_550._0_8_ =
                         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar21;
                  }
                  local_550._8_8_ = *(texcoord2f *)(puVar21 + 1);
                  *puVar21 = paVar20;
                  puVar21[1] = 0;
                  *(undefined1 *)(puVar21 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)local_4a8,(string *)local_550);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_550._0_8_ !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_540) {
                    operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                  }
                  if (local_510 != (undefined1  [8])&local_500) {
                    operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                ::std::ios_base::~ios_base(local_358);
                AttrMetas::operator=(&local_3d0->_metas,(AttrMetas *)(p_Var23 + 7));
                pcVar29 = "inputs:sourceColorSpace";
                pcVar24 = "";
LAB_00238a72:
                _local_3c8 = (texcoord2f)local_3b8;
                iVar13 = 3;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,pcVar29,pcVar24);
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_410,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3c8);
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                goto LAB_00238aa4;
              }
            }
            else {
LAB_00237138:
              if (_local_3c8 != (texcoord2f)local_3b8) {
                operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
              }
            }
            local_3c8 = (undefined1  [4])0x0;
            fStack_3c4 = 0.0;
            uStack_3c0._0_1_ = false;
            uStack_3c0._1_1_ = false;
            uStack_3be = 0;
            fStack_3bc = 0.0;
            local_3b8[8] = -100;
            local_3b8[9] = -0x3d;
            local_3b8[10] = '%';
            local_3b8._11_5_ = 0;
            local_3b8._0_8_ =
                 ::std::
                 _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::SourceColorSpace,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4044:34)>
                 ::_M_manager;
            local_550._0_8_ = local_540;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_550,"inputs:sourceColorSpace","");
            bVar32 = options->strict_allowedToken_check;
            local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)0x0;
            pPStack_40 = (pointer)0x0;
            auStack_60._8_8_ = 0;
            oStack_50.has_value_ = false;
            oStack_50._1_3_ = 0;
            oStack_50.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
            p_Var1 = (_Any_data *)(auStack_60 + 8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (*(code *)local_3b8._0_8_)(p_Var1,(Property *)local_3c8,2);
              pPStack_40 = (pointer)CONCAT53(local_3b8._11_5_,
                                             CONCAT12(local_3b8[10],
                                                      CONCAT11(local_3b8[9],local_3b8[8])));
              local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_3b8._0_8_;
            }
            in_stack_fffffffffffffaa8 = local_520;
            bVar32 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::SourceColorSpace,tinyusdz::UsdUVTexture::SourceColorSpace>
                               ((string *)local_550,bVar32,
                                (EnumHandlerFun<tinyusdz::UsdUVTexture::SourceColorSpace> *)p_Var1,
                                &local_4b0->_attrib,local_3d0,local_4a8,(string *)local_520);
            if (local_48 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (*(code *)local_48)(p_Var1,p_Var1,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_550._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_540) {
              operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
            }
            p_Var31 = local_490;
            iVar13 = 1;
            if (bVar32) {
              AttrMetas::operator=(&local_3d0->_metas,(AttrMetas *)(p_Var23 + 7));
              pcVar29 = "inputs:sourceColorSpace";
              pcVar24 = "";
              goto LAB_00237a1d;
            }
          }
          else {
            iVar13 = ::std::__cxx11::string::compare((char *)p_Var26);
            if (iVar13 == 0) {
              _local_3c8 = (texcoord2f)local_3b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c8,"inputs:wrapS","");
              cVar22 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_410,(key_type *)local_3c8);
              if (_local_3c8 != (texcoord2f)local_3b8) {
                operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
              }
              iVar13 = 3;
              if ((_Rb_tree_header *)cVar22._M_node != &local_410._M_t._M_impl.super__Rb_tree_header
                 ) goto LAB_00238aa4;
              if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                _local_3c8 = (texcoord2f)local_3b8;
                uStack_3c0._0_1_ = false;
                uStack_3c0._1_1_ = false;
                uStack_3be = 0;
                fStack_3bc = 0.0;
                local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
              }
              else {
                Attribute::type_name_abi_cxx11_((string *)local_3c8,&local_4b0->_attrib);
              }
              local_550._0_8_ = local_540;
              local_550._8_4_ = 7.00649e-45;
              local_550._12_4_ = 0.0;
              local_540._0_6_ = 0x6e656b6f74;
              if (CONCAT44(fStack_3bc,CONCAT22(uStack_3be,uStack_3c0)) == 5) {
                iVar13 = bcmp((void *)_local_3c8,local_540,5);
                if ((iVar13 != 0) ||
                   (uVar3 = *(uint *)((long)&p_Var23[0x17]._M_parent + 4), 1 < uVar3))
                goto LAB_0023748c;
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if (uVar3 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xff5);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"inputs:wrapS",0xc);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"\n",1);
                  if (local_4a8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    puVar21 = (undefined8 *)
                              ::std::__cxx11::string::_M_append
                                        (local_510,(ulong)(local_520->_metas).interpolation);
                    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)(puVar21 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar21 == paVar20) {
                      local_540._0_8_ = paVar20->_M_allocated_capacity;
                      uVar18 = puVar21[3];
                      local_540[8] = (undefined1)uVar18;
                      local_540[9] = (undefined1)((ulong)uVar18 >> 8);
                      local_540[10] = (undefined1)((ulong)uVar18 >> 0x10);
                      local_540._11_5_ = (undefined5)((ulong)uVar18 >> 0x18);
                      local_550._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_540;
                    }
                    else {
                      local_540._0_8_ = paVar20->_M_allocated_capacity;
                      local_550._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)*puVar21;
                    }
                    local_550._8_8_ = *(texcoord2f *)(puVar21 + 1);
                    *puVar21 = paVar20;
                    puVar21[1] = 0;
                    *(undefined1 *)(puVar21 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)local_4a8,(string *)local_550);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540) {
                      operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                    }
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                  ::std::ios_base::~ios_base(local_358);
                  AttrMetas::operator=(&local_3d8->_metas,(AttrMetas *)(p_Var23 + 7));
                  pcVar29 = "inputs:wrapS";
                  pcVar24 = "";
                  goto LAB_00238a72;
                }
              }
              else {
LAB_0023748c:
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
              }
              local_3c8 = (undefined1  [4])0x0;
              fStack_3c4 = 0.0;
              uStack_3c0._0_1_ = false;
              uStack_3c0._1_1_ = false;
              uStack_3be = 0;
              fStack_3bc = 0.0;
              local_3b8[8] = -4;
              local_3b8[9] = -0x33;
              local_3b8[10] = '%';
              local_3b8._11_5_ = 0;
              local_3b8._0_8_ =
                   ::std::
                   _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                   ::_M_manager;
              local_550._0_8_ = local_540;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_550,"inputs:wrapS","");
              bVar32 = options->strict_allowedToken_check;
              local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
              auStack_60._0_8_ = 0;
              auStack_80._8_8_ = 0;
              _Stack_70._M_p = (pointer)0x0;
              p_Var1 = (_Any_data *)(auStack_80 + 8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (*(code *)local_3b8._0_8_)(p_Var1,(Property *)local_3c8,2);
                auStack_60._0_8_ =
                     CONCAT53(local_3b8._11_5_,
                              CONCAT12(local_3b8[10],CONCAT11(local_3b8[9],local_3b8[8])));
                local_68 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_3b8._0_8_;
              }
              in_stack_fffffffffffffaa8 = local_520;
              bVar32 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                                 ((string *)local_550,bVar32,
                                  (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)p_Var1,
                                  &local_4b0->_attrib,local_3d8,local_4a8,(string *)local_520);
              if (local_68 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (*(code *)local_68)(p_Var1,p_Var1,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              p_Var31 = local_490;
              iVar13 = 1;
              if (!bVar32) goto LAB_00237a4e;
              AttrMetas::operator=(&local_3d8->_metas,(AttrMetas *)(p_Var23 + 7));
              pcVar29 = "inputs:wrapS";
              pcVar24 = "";
LAB_00237a1d:
              local_550._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_540;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_550,pcVar29,pcVar24)
              ;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_410,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_550);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              iVar13 = 3;
            }
            else {
              iVar13 = ::std::__cxx11::string::compare((char *)p_Var26);
              if (iVar13 != 0) {
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,*(long *)(p_Var23 + 1),
                           (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
                _local_3c8 = (texcoord2f)local_3b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,"outputs:r","");
                pPVar30 = (Property *)local_3c8;
                anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                          ((ParseResult *)local_550,&local_410,&local_d8,local_4b0,
                           (string *)local_3c8,(TypedTerminalAttribute<float> *)local_188._16_8_);
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                iVar13 = 0;
                if ((local_550._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_00237af1:
                  bVar32 = false;
                }
                else {
                  bVar32 = true;
                  if (local_550._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xffa);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_4e0 = (undefined1  [8])local_4d0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4e0,
                               "Parsing shader output property `{}` failed. Error: {}","");
                    fmt::format<char[10],std::__cxx11::string>
                              ((string *)local_510,(fmt *)local_4e0,(string *)"outputs:r",
                               (char (*) [10])(local_550 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar30);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_510,(long)local_508);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    if (local_4e0 != (undefined1  [8])local_4d0) {
                      operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                    }
                    if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ptVar15 = (texcoord2f *)
                                ::std::__cxx11::string::_M_append
                                          (local_4e0,(ulong)(local_520->_metas).interpolation);
                      tVar6 = (texcoord2f)(ptVar15 + 2);
                      if (*ptVar15 == tVar6) {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        tVar5 = ptVar15[3];
                        local_500._M_local_buf[8] = tVar5.s._0_1_;
                        local_500._M_local_buf[9] = tVar5.s._1_1_;
                        local_500._M_local_buf[10] = tVar5.s._2_1_;
                        local_500._11_5_ = tVar5._3_5_;
                        local_510 = (undefined1  [8])&local_500;
                      }
                      else {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        local_510 = (undefined1  [8])*ptVar15;
                      }
                      local_508 = ptVar15[1];
                      *ptVar15 = tVar6;
                      ptVar15[1].s = 0.0;
                      ptVar15[1].t = 0.0;
                      *(undefined1 *)&ptVar15[2].s = 0;
                      ::std::__cxx11::string::operator=((string *)local_520,(string *)local_510);
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                      if (local_4e0 != (undefined1  [8])local_4d0) {
                        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                    iVar13 = 1;
                    goto LAB_00237af1;
                  }
                }
                if (local_550._8_8_ != (long)local_540 + 8) {
                  operator_delete((void *)local_550._8_8_,
                                  CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8]))) + 1);
                }
                if (!bVar32) goto LAB_00238aa4;
                local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,*(long *)(p_Var23 + 1),
                           (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
                _local_3c8 = (texcoord2f)local_3b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,"outputs:g","");
                pPVar30 = (Property *)local_3c8;
                anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                          ((ParseResult *)local_550,&local_410,&local_f8,local_4b0,
                           (string *)local_3c8,(TypedTerminalAttribute<float> *)local_188.data._0_8_
                          );
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                  operator_delete(local_f8._M_dataplus._M_p,
                                  local_f8.field_2._M_allocated_capacity + 1);
                }
                iVar13 = 0;
                if ((local_550._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_00237e2f:
                  bVar32 = false;
                }
                else {
                  bVar32 = true;
                  if (local_550._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xffc);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_4e0 = (undefined1  [8])local_4d0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4e0,
                               "Parsing shader output property `{}` failed. Error: {}","");
                    fmt::format<char[10],std::__cxx11::string>
                              ((string *)local_510,(fmt *)local_4e0,(string *)"outputs:g",
                               (char (*) [10])(local_550 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar30);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_510,(long)local_508);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    if (local_4e0 != (undefined1  [8])local_4d0) {
                      operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                    }
                    if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ptVar15 = (texcoord2f *)
                                ::std::__cxx11::string::_M_append
                                          (local_4e0,(ulong)(local_520->_metas).interpolation);
                      tVar6 = (texcoord2f)(ptVar15 + 2);
                      if (*ptVar15 == tVar6) {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        tVar5 = ptVar15[3];
                        local_500._M_local_buf[8] = tVar5.s._0_1_;
                        local_500._M_local_buf[9] = tVar5.s._1_1_;
                        local_500._M_local_buf[10] = tVar5.s._2_1_;
                        local_500._11_5_ = tVar5._3_5_;
                        local_510 = (undefined1  [8])&local_500;
                      }
                      else {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        local_510 = (undefined1  [8])*ptVar15;
                      }
                      local_508 = ptVar15[1];
                      *ptVar15 = tVar6;
                      ptVar15[1].s = 0.0;
                      ptVar15[1].t = 0.0;
                      *(undefined1 *)&ptVar15[2].s = 0;
                      ::std::__cxx11::string::operator=((string *)local_520,(string *)local_510);
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                      if (local_4e0 != (undefined1  [8])local_4d0) {
                        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                    iVar13 = 1;
                    goto LAB_00237e2f;
                  }
                }
                if (local_550._8_8_ != (long)local_540 + 8) {
                  operator_delete((void *)local_550._8_8_,
                                  CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8]))) + 1);
                }
                if (!bVar32) goto LAB_00238aa4;
                local_118._M_allocated_capacity = (size_type)&local_108;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_118,*(long *)(p_Var23 + 1),
                           (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
                _local_3c8 = (texcoord2f)local_3b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,"outputs:b","");
                pPVar30 = (Property *)local_3c8;
                anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                          ((ParseResult *)local_550,&local_410,(string *)&local_118,local_4b0,
                           (string *)local_3c8,local_190);
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_allocated_capacity != &local_108) {
                  operator_delete((void *)local_118._M_allocated_capacity,
                                  local_108._M_allocated_capacity + 1);
                }
                iVar13 = 0;
                if ((local_550._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_0023813c:
                  bVar32 = false;
                }
                else {
                  bVar32 = true;
                  if (local_550._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xffe);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_4e0 = (undefined1  [8])local_4d0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4e0,
                               "Parsing shader output property `{}` failed. Error: {}","");
                    fmt::format<char[10],std::__cxx11::string>
                              ((string *)local_510,(fmt *)local_4e0,(string *)"outputs:b",
                               (char (*) [10])(local_550 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar30);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_510,(long)local_508);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    if (local_4e0 != (undefined1  [8])local_4d0) {
                      operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                    }
                    if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ptVar15 = (texcoord2f *)
                                ::std::__cxx11::string::_M_append
                                          (local_4e0,(ulong)(local_520->_metas).interpolation);
                      tVar6 = (texcoord2f)(ptVar15 + 2);
                      if (*ptVar15 == tVar6) {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        tVar5 = ptVar15[3];
                        local_500._M_local_buf[8] = tVar5.s._0_1_;
                        local_500._M_local_buf[9] = tVar5.s._1_1_;
                        local_500._M_local_buf[10] = tVar5.s._2_1_;
                        local_500._11_5_ = tVar5._3_5_;
                        local_510 = (undefined1  [8])&local_500;
                      }
                      else {
                        local_500._M_allocated_capacity = *(undefined8 *)tVar6;
                        local_510 = (undefined1  [8])*ptVar15;
                      }
                      local_508 = ptVar15[1];
                      *ptVar15 = tVar6;
                      ptVar15[1].s = 0.0;
                      ptVar15[1].t = 0.0;
                      *(undefined1 *)&ptVar15[2].s = 0;
                      ::std::__cxx11::string::operator=((string *)local_520,(string *)local_510);
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                      if (local_4e0 != (undefined1  [8])local_4d0) {
                        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                    iVar13 = 1;
                    goto LAB_0023813c;
                  }
                }
                if (local_550._8_8_ != (long)local_540 + 8) {
                  operator_delete((void *)local_550._8_8_,
                                  CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8]))) + 1);
                }
                if (!bVar32) goto LAB_00238aa4;
                local_138._0_8_ = local_138 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_138,*(long *)(p_Var23 + 1),
                           (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
                _local_3c8 = (texcoord2f)local_3b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,"outputs:a","");
                pPVar30 = (Property *)local_3c8;
                anon_unknown_0::ParseShaderOutputTerminalAttribute<float>
                          ((ParseResult *)local_550,&local_410,(string *)local_138,local_4b0,
                           (string *)local_3c8,
                           (TypedTerminalAttribute<float> *)local_1b8.contained._24_8_);
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
                  operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
                }
                iVar13 = 0;
                if ((local_550._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_0023840b:
                  bVar32 = false;
                }
                else {
                  bVar32 = true;
                  if (local_550._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0x1000);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_4e0 = (undefined1  [8])local_4d0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4e0,
                               "Parsing shader output property `{}` failed. Error: {}","");
                    fmt::format<char[10],std::__cxx11::string>
                              ((string *)local_510,(fmt *)local_4e0,(string *)"outputs:a",
                               (char (*) [10])(local_550 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar30);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_510,(long)local_508);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    if (local_4e0 != (undefined1  [8])local_4d0) {
                      operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                    }
                    if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      pTVar8 = local_520;
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_510,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_4e0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_520);
                      ::std::__cxx11::string::operator=((string *)pTVar8,(string *)local_510);
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                      if (local_4e0 != (undefined1  [8])local_4d0) {
                        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                    iVar13 = 1;
                    goto LAB_0023840b;
                  }
                }
                if (local_550._8_8_ != (long)local_540 + 8) {
                  operator_delete((void *)local_550._8_8_,
                                  CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8]))) + 1);
                }
                if (!bVar32) goto LAB_00238aa4;
                local_158[0] = (_Base_ptr)local_148;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_158,*(long *)(p_Var23 + 1),
                           (long)&(p_Var23[1]._M_parent)->_M_color + *(long *)(p_Var23 + 1));
                _local_3c8 = (texcoord2f)local_3b8;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3c8,"outputs:rgb","");
                pPVar30 = (Property *)local_3c8;
                (anonymous_namespace)::ParseShaderOutputTerminalAttribute<std::array<float,3ul>>
                          ((ParseResult *)local_550,(_anonymous_namespace_ *)&local_410,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_158,(string *)local_4b0,(Property *)local_3c8,
                           (string *)local_1b8.contained._16_8_,in_stack_fffffffffffffaa8);
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if (local_158[0] != (_Base_ptr)local_148) {
                  operator_delete(local_158[0],(ulong)((long)&local_148[0]->_M_color + 1));
                }
                iVar13 = 0;
                if ((local_550._0_8_ & 0xfffffffd) == 0) {
                  iVar13 = 3;
LAB_002386e2:
                  bVar32 = false;
                }
                else {
                  bVar32 = true;
                  if (local_550._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0x1002);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    local_4e0 = (undefined1  [8])local_4d0;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_4e0,
                               "Parsing shader output property `{}` failed. Error: {}","");
                    fmt::format<char[12],std::__cxx11::string>
                              ((string *)local_510,(fmt *)local_4e0,(string *)"outputs:rgb",
                               (char (*) [12])(local_550 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar30);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_510,(long)local_508);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                    if (local_4e0 != (undefined1  [8])local_4d0) {
                      operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                    }
                    if (local_520 != (TypedTerminalAttribute<std::array<float,_3UL>_> *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      pTVar8 = local_520;
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_510,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_4e0,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_520);
                      ::std::__cxx11::string::operator=((string *)pTVar8,(string *)local_510);
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                      if (local_4e0 != (undefined1  [8])local_4d0) {
                        operator_delete((void *)local_4e0,(ulong)(local_4d0._0_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                    iVar13 = 1;
                    goto LAB_002386e2;
                  }
                }
                if (local_550._8_8_ != (long)local_540 + 8) {
                  operator_delete((void *)local_550._8_8_,
                                  CONCAT53(local_540._11_5_,
                                           CONCAT12(local_540[10],
                                                    CONCAT11(local_540[9],local_540[8]))) + 1);
                }
                if (bVar32) {
                  cVar22 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_410,(key_type *)p_Var26);
                  p_Var2 = &local_410._M_t._M_impl.super__Rb_tree_header;
                  if ((_Rb_tree_header *)cVar22._M_node == p_Var2) {
                    this = ::std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                         *)local_1b8.contained._8_8_,(key_type *)p_Var26);
                    Property::operator=(this,local_4b0);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&local_410,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var26);
                  }
                  cVar22 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_410,(key_type *)p_Var26);
                  iVar13 = 0;
                  if ((_Rb_tree_header *)cVar22._M_node == p_Var2) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"[warn]",6);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"ReconstructShader",0x11);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3c8,"():",3);
                    poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0x1004);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_550,"Unsupported/unimplemented property: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)p_Var26);
                    poVar14 = ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3c8,(char *)local_550._0_8_,
                                         local_550._8_8_);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540) {
                      operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                    }
                    if (local_4a8 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_550,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_510,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_520);
                      ::std::__cxx11::string::operator=((string *)local_4a8,(string *)local_550);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_550._0_8_ !=
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_540) {
                        operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                      }
                      if (local_510 != (undefined1  [8])&local_500) {
                        operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                    ::std::ios_base::~ios_base(local_358);
                  }
                }
                goto LAB_00238aa4;
              }
              _local_3c8 = (texcoord2f)local_3b8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_3c8,"inputs:wrapT","");
              cVar22 = ::std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&local_410,(key_type *)local_3c8);
              if (_local_3c8 != (texcoord2f)local_3b8) {
                operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
              }
              iVar13 = 3;
              if ((_Rb_tree_header *)cVar22._M_node != &local_410._M_t._M_impl.super__Rb_tree_header
                 ) goto LAB_00238aa4;
              if (((ulong)p_Var23[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                _local_3c8 = (texcoord2f)local_3b8;
                uStack_3c0._0_1_ = false;
                uStack_3c0._1_1_ = false;
                uStack_3be = 0;
                fStack_3bc = 0.0;
                local_3b8._0_8_ = local_3b8._0_8_ & 0xffffffffffffff00;
              }
              else {
                Attribute::type_name_abi_cxx11_((string *)local_3c8,&local_4b0->_attrib);
              }
              local_550._0_8_ = local_540;
              local_550._8_4_ = 7.00649e-45;
              local_550._12_4_ = 0.0;
              local_540._0_6_ = 0x6e656b6f74;
              if (CONCAT44(fStack_3bc,CONCAT22(uStack_3be,uStack_3c0)) == 5) {
                iVar13 = bcmp((void *)_local_3c8,local_540,5);
                if ((iVar13 != 0) ||
                   (uVar3 = *(uint *)((long)&p_Var23[0x17]._M_parent + 4), 1 < uVar3))
                goto LAB_002378ab;
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
                if (uVar3 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3c8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"ReconstructShader",0x11);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"():",3)
                  ;
                  poVar14 = (ostream *)::std::ostream::operator<<((Property *)local_3c8,0xff8);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"inputs:wrapT",0xc);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3c8,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3c8,"\n",1);
                  if (local_4a8 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_550,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_510,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_520);
                    ::std::__cxx11::string::operator=((string *)local_4a8,(string *)local_550);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_550._0_8_ !=
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_540) {
                      operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
                    }
                    if (local_510 != (undefined1  [8])&local_500) {
                      operator_delete((void *)local_510,local_500._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3c8);
                  ::std::ios_base::~ios_base(local_358);
                  AttrMetas::operator=(&local_3e0->_metas,(AttrMetas *)(p_Var23 + 7));
                  pcVar29 = "inputs:wrapT";
                  pcVar24 = "";
                  goto LAB_00238a72;
                }
              }
              else {
LAB_002378ab:
                if (_local_3c8 != (texcoord2f)local_3b8) {
                  operator_delete((void *)_local_3c8,(ulong)(local_3b8._0_8_ + 1));
                }
              }
              local_3c8 = (undefined1  [4])0x0;
              fStack_3c4 = 0.0;
              uStack_3c0._0_1_ = false;
              uStack_3c0._1_1_ = false;
              uStack_3be = 0;
              fStack_3bc = 0.0;
              local_3b8[8] = -4;
              local_3b8[9] = -0x33;
              local_3b8[10] = '%';
              local_3b8._11_5_ = 0;
              local_3b8._0_8_ =
                   ::std::
                   _Function_handler<nonstd::expected_lite::expected<tinyusdz::UsdUVTexture::Wrap,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc:4057:22)>
                   ::_M_manager;
              local_550._0_8_ = local_540;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_550,"inputs:wrapT","");
              bVar32 = options->strict_allowedToken_check;
              local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
              auStack_80._0_8_ = 0;
              local_98._M_unused._M_object = (void *)0x0;
              local_98._8_8_ = (pointer)0x0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (*(code *)local_3b8._0_8_)(&local_98,(Property *)local_3c8,2);
                auStack_80._0_8_ =
                     CONCAT53(local_3b8._11_5_,
                              CONCAT12(local_3b8[10],CONCAT11(local_3b8[9],local_3b8[8])));
                local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)local_3b8._0_8_;
              }
              in_stack_fffffffffffffaa8 = local_520;
              bVar32 = ParseTimeSampledEnumProperty<tinyusdz::UsdUVTexture::Wrap,tinyusdz::UsdUVTexture::Wrap>
                                 ((string *)local_550,bVar32,
                                  (EnumHandlerFun<tinyusdz::UsdUVTexture::Wrap> *)&local_98,
                                  &local_4b0->_attrib,local_3e0,local_4a8,(string *)local_520);
              if (local_88 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                (*(code *)local_88)(&local_98,&local_98,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_550._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_540) {
                operator_delete((void *)local_550._0_8_,local_540._0_8_ + 1);
              }
              p_Var31 = local_490;
              iVar13 = 1;
              if (bVar32) {
                AttrMetas::operator=(&local_3e0->_metas,(AttrMetas *)(p_Var23 + 7));
                pcVar29 = "inputs:wrapT";
                pcVar24 = "";
                goto LAB_00237a1d;
              }
            }
          }
LAB_00237a4e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (*(code *)local_3b8._0_8_)((Property *)local_3c8,(Property *)local_3c8,3);
          }
        }
      }
LAB_00238aa4:
      if ((iVar13 != 3) && (iVar13 != 0)) break;
      p_Var23 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var23);
      local_511 = p_Var23 == p_Var31;
    } while (!local_511);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_410,
             (_Link_type)local_410._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(local_511 & 1);
}

Assistant:

bool ReconstructShader<UsdUVTexture>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdUVTexture *texture,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;

  auto SourceColorSpaceHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::SourceColorSpace, std::string> {
    using EnumTy = std::pair<UsdUVTexture::SourceColorSpace, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::SourceColorSpace::Auto, "auto"),
        std::make_pair(UsdUVTexture::SourceColorSpace::Raw, "raw"),
        std::make_pair(UsdUVTexture::SourceColorSpace::SRGB, "sRGB"),
    };

    return EnumHandler<UsdUVTexture::SourceColorSpace>(
        "inputs:sourceColorSpace", tok, enums);
  };

  auto WrapHandler = [](const std::string &tok)
      -> nonstd::expected<UsdUVTexture::Wrap, std::string> {
    using EnumTy = std::pair<UsdUVTexture::Wrap, const char *>;
    const std::vector<EnumTy> enums = {
        std::make_pair(UsdUVTexture::Wrap::UseMetadata, "useMetadata"),
        std::make_pair(UsdUVTexture::Wrap::Black, "black"),
        std::make_pair(UsdUVTexture::Wrap::Clamp, "clamp"),
        std::make_pair(UsdUVTexture::Wrap::Repeat, "repeat"),
        std::make_pair(UsdUVTexture::Wrap::Mirror, "mirror"),
    };

    return EnumHandler<UsdUVTexture::Wrap>(
        "inputs:wrap*", tok, enums);
  };

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    DCOUT("prop.name = " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:file", UsdUVTexture, texture->file)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:st", UsdUVTexture,
                          texture->st)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:sourceColorSpace",
                       UsdUVTexture::SourceColorSpace, SourceColorSpaceHandler, UsdUVTexture,
                       texture->sourceColorSpace, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapS",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapS, options.strict_allowedToken_check)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, "inputs:wrapT",
                       UsdUVTexture::Wrap, WrapHandler, UsdUVTexture,
                       texture->wrapT, options.strict_allowedToken_check)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:r", UsdUVTexture,
                                  texture->outputsR)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:g", UsdUVTexture,
                                  texture->outputsG)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:b", UsdUVTexture,
                                  texture->outputsB)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:a", UsdUVTexture,
                                  texture->outputsA)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:rgb", UsdUVTexture,
                                  texture->outputsRGB)
    ADD_PROPERTY(table, prop, UsdUVTexture, texture->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  DCOUT("UsdUVTexture reconstructed.");
  return true;
}